

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

bool __thiscall
spvtools::val::ValidationState_t::IsFloatVectorType(ValidationState_t *this,uint32_t id)

{
  const_iterator cVar1;
  uint32_t local_20;
  uint32_t local_1c;
  
  local_20 = id;
  cVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->all_definitions_)._M_h,&local_20);
  if (((cVar1.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
        ._M_cur != (__node_type *)0x0) &&
      (*(long *)((long)cVar1.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                       ._M_cur + 0x10) != 0)) &&
     (*(short *)(*(long *)((long)cVar1.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                 ._M_cur + 0x10) + 0x3a) == 0x17)) {
    local_1c = GetComponentType(this,id);
    cVar1 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->all_definitions_)._M_h,&local_1c);
    if ((cVar1.
         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
         ._M_cur != (__node_type *)0x0) &&
       (*(long *)((long)cVar1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                        ._M_cur + 0x10) != 0)) {
      return *(short *)(*(long *)((long)cVar1.
                                        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                        ._M_cur + 0x10) + 0x3a) == 0x16;
    }
  }
  return false;
}

Assistant:

bool ValidationState_t::IsFloatVectorType(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  if (!inst) {
    return false;
  }

  if (inst->opcode() == spv::Op::OpTypeVector) {
    return IsFloatScalarType(GetComponentType(id));
  }

  return false;
}